

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall
cmCTestSVN::StatusParser::DoPath(StatusParser *this,char path_status,char prop_status,string *path)

{
  uint uVar1;
  undefined8 uVar2;
  
  if (path_status != ' ') {
    prop_status = path_status;
  }
  uVar2 = 1;
  uVar1 = (byte)prop_status - 0x41;
  if (uVar1 < 0x3e) {
    if ((0x21009UL >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_002049a3;
    if ((0x2000000000000004U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      uVar2 = 2;
      goto LAB_002049a3;
    }
  }
  if (prop_status != 0x21) {
    return;
  }
LAB_002049a3:
  (*(this->SVN->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this->SVN,uVar2,path);
  return;
}

Assistant:

void DoPath(char path_status, char prop_status, std::string const& path)
  {
    char status = (path_status != ' ') ? path_status : prop_status;
    // See "svn help status".
    switch (status) {
      case 'M':
      case '!':
      case 'A':
      case 'D':
      case 'R':
        this->SVN->DoModification(PathModified, path);
        break;
      case 'C':
      case '~':
        this->SVN->DoModification(PathConflicting, path);
        break;
      case 'X':
      case 'I':
      case '?':
      case ' ':
      default:
        break;
    }
  }